

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

DESCRIPTOR_DATA * new_descriptor(void)

{
  DESCRIPTOR_DATA *d;
  DESCRIPTOR_DATA *local_8;
  
  if (descriptor_free == (DESCRIPTOR_DATA *)0x0) {
    local_8 = (DESCRIPTOR_DATA *)operator_new(0x6c78);
  }
  else {
    local_8 = descriptor_free;
    descriptor_free = descriptor_free->next;
  }
  memcpy(local_8,&new_descriptor::d_zero,0x6c78);
  local_8->valid = true;
  return local_8;
}

Assistant:

DESCRIPTOR_DATA *new_descriptor(void)
{
	static DESCRIPTOR_DATA d_zero;
	DESCRIPTOR_DATA *d;

	if (descriptor_free == nullptr)
		d = new DESCRIPTOR_DATA;
	else
	{
		d = descriptor_free;
		descriptor_free = descriptor_free->next;
	}

	*d = d_zero;

	d->valid = true;
	return d;
}